

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::QListView(QListView *this,QListViewPrivate *dd,QWidget *parent)

{
  QAbstractItemView::QAbstractItemView
            ((QAbstractItemView *)this,&dd->super_QAbstractItemViewPrivate,parent);
  *(undefined ***)
   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
       &PTR_metaObject_007e78e8;
  *(undefined ***)
   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
    super_QPaintDevice = &PTR__QListView_007e7bf8;
  setViewMode(this,ListMode);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this,SingleSelection);
  QWidget::setAttribute((QWidget *)this,WA_MacShowFocusRect,true);
  QFramePrivate::updateStyledFrameWidths
            (*(QFramePrivate **)
              &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
               field_0x8);
  return;
}

Assistant:

QListView::QListView(QListViewPrivate &dd, QWidget *parent)
    : QAbstractItemView(dd, parent)
{
    setViewMode(ListMode);
    setSelectionMode(SingleSelection);
    setAttribute(Qt::WA_MacShowFocusRect);
    Q_D(QListView);               // We rely on a qobject_cast for PM_DefaultFrameWidth to change
    d->updateStyledFrameWidths(); // hence we have to force an update now that the object has been constructed
}